

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O2

CFGNode * __thiscall
dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches
          (CFGStructurizer *this,CFGNode *node,CFGNode *must_reach,CFGNode *must_reach_frontier)

{
  CFGNode *from;
  pointer ppCVar1;
  CFGNode *to;
  bool bVar2;
  ulong uVar3;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  _Var4;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  __first;
  pointer ppCVar5;
  CFGNode *pCVar6;
  long lVar7;
  __node_base *p_Var8;
  const_iterator cVar9;
  long lVar10;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  __i;
  CFGNode **ppCVar11;
  Vector<CFGNode_*> frontiers;
  CFGNode *pdoms;
  CFGNode *frontier;
  UnorderedSet<const_CFGNode_*> promoted_post_dominators;
  _Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> local_c8;
  CFGNode *local_b0;
  CFGNode **local_a8;
  CFGNode *local_a0;
  CFGNode *local_98;
  CFGNode *local_90;
  CFGNode **local_88;
  CFGNode *local_80;
  pointer local_78;
  CFGNode *local_70;
  _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_a0 = must_reach_frontier;
  local_70 = node;
  std::__detail::
  _Insert_base<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::insert((_Insert_base<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)&local_68,&local_70);
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
            ((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
             &local_c8,&local_70->post_dominance_frontier);
  local_98 = (CFGNode *)this;
  local_80 = must_reach;
  bVar2 = query_reachability(this,local_70,must_reach);
  if (!bVar2) {
    __assert_fail("query_reachability(*node, *must_reach)",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                  ,0x1b48,
                  "CFGNode *dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(const CFGNode *, const CFGNode *, const CFGNode *) const"
                 );
  }
  if (local_c8._M_impl.super__Vector_impl_data._M_start !=
      local_c8._M_impl.super__Vector_impl_data._M_finish) {
    while (ppCVar5 = local_c8._M_impl.super__Vector_impl_data._M_finish,
          local_c8._M_impl.super__Vector_impl_data._M_start !=
          local_c8._M_impl.super__Vector_impl_data._M_finish) {
      if (local_a0 != (CFGNode *)0x0) {
        local_b0 = local_98;
        local_90 = local_98;
        lVar10 = (long)local_c8._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_c8._M_impl.super__Vector_impl_data._M_start;
        _Var4._M_current = local_c8._M_impl.super__Vector_impl_data._M_start;
        local_a8 = &local_a0;
        local_88 = &local_a0;
        for (lVar7 = lVar10 >> 5; cVar9._M_current = ppCVar5, 0 < lVar7; lVar7 = lVar7 + -1) {
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::$_0>
                  ::operator()((_Iter_pred<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__0>
                                *)&local_90,_Var4);
          __first._M_current = _Var4._M_current;
          if (bVar2) goto LAB_00136a69;
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::$_0>
                  ::operator()((_Iter_pred<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__0>
                                *)&local_90,
                               (__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                )(_Var4._M_current + 1));
          __first._M_current = _Var4._M_current + 1;
          if (bVar2) goto LAB_00136a69;
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::$_0>
                  ::operator()((_Iter_pred<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__0>
                                *)&local_90,
                               (__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                )(_Var4._M_current + 2));
          __first._M_current = _Var4._M_current + 2;
          if (bVar2) goto LAB_00136a69;
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::$_0>
                  ::operator()((_Iter_pred<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__0>
                                *)&local_90,
                               (__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                )(_Var4._M_current + 3));
          __first._M_current = _Var4._M_current + 3;
          if (bVar2) goto LAB_00136a69;
          _Var4._M_current = _Var4._M_current + 4;
          lVar10 = lVar10 + -0x20;
        }
        lVar10 = lVar10 >> 3;
        if (lVar10 == 1) {
LAB_00136c1a:
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::$_0>
                  ::operator()((_Iter_pred<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__0>
                                *)&local_90,_Var4);
          __first._M_current = _Var4._M_current;
          if (!bVar2) {
            __first._M_current = ppCVar5;
          }
LAB_00136a69:
          _Var4._M_current = __first._M_current;
          if (__first._M_current != ppCVar5) {
            while (_Var4._M_current = _Var4._M_current + 1,
                  cVar9._M_current = local_c8._M_impl.super__Vector_impl_data._M_finish,
                  _Var4._M_current != ppCVar5) {
              bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::$_0>
                      ::operator()((_Iter_pred<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__0>
                                    *)&local_b0,_Var4);
              if (!bVar2) {
                *__first._M_current = *_Var4._M_current;
                __first._M_current = __first._M_current + 1;
              }
            }
          }
        }
        else {
          if (lVar10 == 2) {
LAB_00136a45:
            bVar2 = __gnu_cxx::__ops::
                    _Iter_pred<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::$_0>
                    ::operator()((_Iter_pred<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__0>
                                  *)&local_90,_Var4);
            __first._M_current = _Var4._M_current;
            if (!bVar2) {
              _Var4._M_current = _Var4._M_current + 1;
              goto LAB_00136c1a;
            }
            goto LAB_00136a69;
          }
          __first._M_current = ppCVar5;
          if (lVar10 == 3) {
            bVar2 = __gnu_cxx::__ops::
                    _Iter_pred<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::$_0>
                    ::operator()((_Iter_pred<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__0>
                                  *)&local_90,_Var4);
            __first._M_current = _Var4._M_current;
            if (!bVar2) {
              _Var4._M_current = _Var4._M_current + 1;
              goto LAB_00136a45;
            }
            goto LAB_00136a69;
          }
        }
        std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
        erase((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
              &local_c8,(const_iterator)__first._M_current,cVar9);
      }
      ppCVar1 = local_c8._M_impl.super__Vector_impl_data._M_finish;
      ppCVar5 = local_c8._M_impl.super__Vector_impl_data._M_start;
      lVar7 = (long)local_c8._M_impl.super__Vector_impl_data._M_finish -
              (long)local_c8._M_impl.super__Vector_impl_data._M_start;
      uVar3 = lVar7 >> 3;
      if (uVar3 < 2) {
        if (local_c8._M_impl.super__Vector_impl_data._M_start ==
            local_c8._M_impl.super__Vector_impl_data._M_finish) break;
      }
      else {
        if (local_c8._M_impl.super__Vector_impl_data._M_start !=
            local_c8._M_impl.super__Vector_impl_data._M_finish) {
          lVar10 = 0x3f;
          if (uVar3 != 0) {
            for (; uVar3 >> lVar10 == 0; lVar10 = lVar10 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__1>>
                    (local_c8._M_impl.super__Vector_impl_data._M_start,
                     local_c8._M_impl.super__Vector_impl_data._M_finish,
                     ((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
          if (lVar7 < 0x81) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__1>>
                      (ppCVar5,ppCVar1);
          }
          else {
            ppCVar11 = ppCVar5 + 0x10;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__1>>
                      (ppCVar5,ppCVar11);
            for (; ppCVar11 != ppCVar1; ppCVar11 = ppCVar11 + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Val_comp_iter<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__1>>
                        (ppCVar11);
            }
          }
        }
        _Var4 = std::
                __unique<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                          (local_c8._M_impl.super__Vector_impl_data._M_start,
                           local_c8._M_impl.super__Vector_impl_data._M_finish);
        std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
        erase((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
              &local_c8,(const_iterator)_Var4._M_current,
              (const_iterator)local_c8._M_impl.super__Vector_impl_data._M_finish);
      }
      to = local_80;
      local_90 = local_c8._M_impl.super__Vector_impl_data._M_finish[-1];
      local_78 = (local_90->succ).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      for (ppCVar5 = (local_90->succ).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppCVar5 != local_78;
          ppCVar5 = ppCVar5 + 1) {
        from = *ppCVar5;
        bVar2 = query_reachability((CFGStructurizer *)local_98,from,to);
        if (bVar2) {
          p_Var8 = &local_68._M_before_begin;
          do {
            p_Var8 = p_Var8->_M_nxt;
            pCVar6 = local_90;
            if (p_Var8 == (__node_base *)0x0) goto LAB_00136c44;
            bVar2 = CFGNode::post_dominates((CFGNode *)p_Var8[1]._M_nxt,from);
          } while (!bVar2);
        }
      }
      std::__detail::
      _Insert_base<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&local_68,(value_type *)&local_90);
      local_c8._M_impl.super__Vector_impl_data._M_finish =
           local_c8._M_impl.super__Vector_impl_data._M_finish + -1;
      ppCVar1 = (local_90->post_dominance_frontier).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppCVar5 = (local_90->post_dominance_frontier).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppCVar5 != ppCVar1;
          ppCVar5 = ppCVar5 + 1) {
        local_b0 = *ppCVar5;
        std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
        push_back((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   *)&local_c8,&local_b0);
      }
    }
  }
  pCVar6 = (CFGNode *)0x0;
LAB_00136c44:
  std::_Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
  ~_Vector_base(&local_c8);
  std::
  _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return pCVar6;
}

Assistant:

CFGNode *CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(const CFGNode *node,
                                                                                   const CFGNode *must_reach,
                                                                                   const CFGNode *must_reach_frontier) const
{
	UnorderedSet<const CFGNode *> promoted_post_dominators;
	promoted_post_dominators.insert(node);
	auto frontiers = node->post_dominance_frontier;

	assert(query_reachability(*node, *must_reach));

	if (frontiers.empty())
		return nullptr;

	while (!frontiers.empty())
	{
		// We might not be interested in post-domination-frontiers that we cannot reach.
		// Filter our search based on this.
		if (must_reach_frontier)
		{
			auto itr = std::remove_if(frontiers.begin(), frontiers.end(), [&](CFGNode *candidate) {
			    return !query_reachability(*must_reach_frontier, *candidate);
			});
			frontiers.erase(itr, frontiers.end());
		}

		if (frontiers.size() > 1)
		{
			std::sort(frontiers.begin(), frontiers.end(), [](const CFGNode *a, const CFGNode *b) {
				return a->backward_post_visit_order < b->backward_post_visit_order;
			});
			frontiers.erase(std::unique(frontiers.begin(), frontiers.end()), frontiers.end());
		}
		else if (frontiers.empty())
			break;

		auto *frontier = frontiers.back();

		// For a frontier to be discounted, we look at all successors and check
		// if there no node in promoted_post_dominators that post-dominate the successor, that path cannot reach must_reach.
		// If a post dominance frontier satisfies this rule, it is promoted to be considered an alias of node.

		bool all_succs_must_go_via_node = true;
		for (auto *succ : frontier->succ)
		{
			bool promote = true;
			if (query_reachability(*succ, *must_reach))
			{
				promote = false;
				for (auto *pdom : promoted_post_dominators)
				{
					if (pdom->post_dominates(succ))
					{
						promote = true;
						break;
					}
				}
			}

			if (!promote)
			{
				all_succs_must_go_via_node = false;
				break;
			}
		}

		if (!all_succs_must_go_via_node)
		{
			return frontier;
		}
		else
		{
			promoted_post_dominators.insert(frontier);
			frontiers.pop_back();
			for (auto *pdoms : frontier->post_dominance_frontier)
				frontiers.push_back(pdoms);
		}
	}

	return frontiers.empty() ? nullptr : frontiers.front();
}